

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int derive_mpi(mbedtls_ecp_group *grp,mbedtls_mpi *x,uchar *buf,size_t blen)

{
  int iVar1;
  ulong uVar2;
  size_t local_48;
  size_t use_size;
  size_t n_size;
  int ret;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_mpi *x_local;
  mbedtls_ecp_group *grp_local;
  
  uVar2 = grp->nbits + 7 >> 3;
  local_48 = blen;
  if (uVar2 < blen) {
    local_48 = uVar2;
  }
  n_size._4_4_ = mbedtls_mpi_read_binary(x,buf,local_48);
  if ((n_size._4_4_ == 0) &&
     (((local_48 << 3 <= grp->nbits ||
       (n_size._4_4_ = mbedtls_mpi_shift_r(x,local_48 * 8 - grp->nbits), n_size._4_4_ == 0)) &&
      (iVar1 = mbedtls_mpi_cmp_mpi(x,&grp->N), -1 < iVar1)))) {
    n_size._4_4_ = mbedtls_mpi_sub_mpi(x,x,&grp->N);
  }
  return n_size._4_4_;
}

Assistant:

static int derive_mpi( const mbedtls_ecp_group *grp, mbedtls_mpi *x,
                       const unsigned char *buf, size_t blen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n_size = ( grp->nbits + 7 ) / 8;
    size_t use_size = blen > n_size ? n_size : blen;

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( x, buf, use_size ) );
    if( use_size * 8 > grp->nbits )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( x, use_size * 8 - grp->nbits ) );

    /* While at it, reduce modulo N */
    if( mbedtls_mpi_cmp_mpi( x, &grp->N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( x, x, &grp->N ) );

cleanup:
    return( ret );
}